

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Octree.cpp
# Opt level: O1

void __thiscall
Octree::Update(Octree *this,shared_ptr<myvk::CommandPool> *command_pool,
              shared_ptr<OctreeBuilder> *builder)

{
  element_type *peVar1;
  DescriptorSet *this_00;
  VkDeviceSize VVar2;
  logger *this_01;
  Ptr<BufferBase> local_38;
  undefined8 local_28;
  
  VVar2 = OctreeBuilder::GetOctreeRange
                    ((builder->super___shared_ptr<OctreeBuilder,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                     ,command_pool);
  peVar1 = (builder->super___shared_ptr<OctreeBuilder,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (peVar1->m_octree_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &(peVar1->m_octree_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  this->m_level =
       ((((builder->super___shared_ptr<OctreeBuilder,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        m_voxelizer_ptr).super___shared_ptr<Voxelizer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_level;
  this->m_range = VVar2 & 0xffffffff;
  if ((((this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_BufferBase).m_size < (VVar2 & 0xffffffff)) {
    this_01 = spdlog::default_logger_raw();
    local_38.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_38.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_28 = 0;
    spdlog::logger::log(this_01,0.0);
    VVar2 = (VkDeviceSize)
            (uint)(((this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_BufferBase).m_size;
  }
  this_00 = (this->m_descriptor_set).
            super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_38.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        super_BufferBase;
  local_38.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->m_buffer).super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if (local_38.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_38.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_38.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_38.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_use_count =
           (local_38.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  myvk::DescriptorSet::UpdateStorageBuffer(this_00,&local_38,0,0,0,VVar2 & 0xffffffff);
  if (local_38.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<myvk::BufferBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  return;
}

Assistant:

void Octree::Update(const std::shared_ptr<myvk::CommandPool> &command_pool,
                    const std::shared_ptr<OctreeBuilder> &builder) {
	uint32_t octree_range = builder->GetOctreeRange(command_pool);
	m_buffer = builder->GetOctree();
	m_level = builder->GetLevel();
	m_range = octree_range;

	uint32_t actual_range = octree_range;
	if (m_buffer->GetSize() < actual_range) {
		spdlog::error("Octree size exceed");
		actual_range = m_buffer->GetSize();
	}
	m_descriptor_set->UpdateStorageBuffer(m_buffer, 0, 0, 0, actual_range);
}